

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
LabelState<false>::String
          (LabelState<false> *this,Context<false> *ctx,char *str,SizeType param_3,bool param_4)

{
  vw *all;
  example *ec;
  allocator local_41;
  string local_40;
  
  all = ctx->all;
  ec = ctx->ex;
  std::__cxx11::string::string((string *)&local_40,str,&local_41);
  VW::parse_example_label(all,ec,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return ctx->previous_state;
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType /* len */, bool)
  {
    VW::parse_example_label(*ctx.all, *ctx.ex, str);
    return ctx.previous_state;
  }